

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

void ma_dr_wav_u8_to_f32(float *pOut,ma_uint8 *pIn,size_t sampleCount)

{
  size_t sVar1;
  
  if (sampleCount != 0 && (pIn != (ma_uint8 *)0x0 && pOut != (float *)0x0)) {
    sVar1 = 0;
    do {
      pOut[sVar1] = (float)pIn[sVar1] * 0.007843138 + -1.0;
      sVar1 = sVar1 + 1;
    } while (sampleCount != sVar1);
  }
  return;
}

Assistant:

MA_API void ma_dr_wav_u8_to_f32(float* pOut, const ma_uint8* pIn, size_t sampleCount)
{
    size_t i;
    if (pOut == NULL || pIn == NULL) {
        return;
    }
#ifdef MA_DR_WAV_LIBSNDFILE_COMPAT
    for (i = 0; i < sampleCount; ++i) {
        *pOut++ = (pIn[i] / 256.0f) * 2 - 1;
    }
#else
    for (i = 0; i < sampleCount; ++i) {
        float x = pIn[i];
        x = x * 0.00784313725490196078f;
        x = x - 1;
        *pOut++ = x;
    }
#endif
}